

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

void __thiscall
icu_63::UnicodeString::pinIndices(UnicodeString *this,int32_t *start,int32_t *_length)

{
  int32_t iVar1;
  int32_t len;
  int32_t *_length_local;
  int32_t *start_local;
  UnicodeString *this_local;
  
  iVar1 = length(this);
  if (*start < 0) {
    *start = 0;
  }
  else if (iVar1 < *start) {
    *start = iVar1;
  }
  if (*_length < 0) {
    *_length = 0;
  }
  else if (iVar1 - *start < *_length) {
    *_length = iVar1 - *start;
  }
  return;
}

Assistant:

inline void
UnicodeString::pinIndices(int32_t& start,
                          int32_t& _length) const
{
  // pin indices
  int32_t len = length();
  if(start < 0) {
    start = 0;
  } else if(start > len) {
    start = len;
  }
  if(_length < 0) {
    _length = 0;
  } else if(_length > (len - start)) {
    _length = (len - start);
  }
}